

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::BuildLayers(S2Builder *this)

{
  _Invoker_type vertices_00;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  reference this_00;
  reference options_00;
  reference input_edge_id_set_ids;
  reference __x;
  reference this_01;
  pointer pLVar6;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *local_2a0;
  function<bool_(const_S2Builder::Graph_&,_S2Error_*)> local_270;
  undefined1 local_250 [8];
  Graph graph;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  undefined1 local_1d8 [4];
  int i_1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_1c0;
  int local_1a4;
  undefined1 local_1a0 [4];
  int i;
  vector<int,_std::allocator<int>_> filter_tmp;
  GraphOptions *options;
  iterator __end2;
  iterator __begin2;
  vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_> *__range2;
  undefined1 local_160 [7];
  bool allow_vertex_filtering;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  layer_vertices;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_130;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_118;
  undefined1 local_f0 [8];
  IdSetLexicon input_edge_id_set_lexicon;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  layer_input_edge_ids;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  layer_edges;
  S2Builder *this_local;
  
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)&layer_input_edge_ids.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&input_edge_id_set_lexicon.tmp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  IdSetLexicon::IdSetLexicon((IdSetLexicon *)local_f0);
  BuildLayerEdges(this,(vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        *)&layer_input_edge_ids.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&input_edge_id_set_lexicon.tmp_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(IdSetLexicon *)local_f0);
  memset(&local_118,0,0x18);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector(&local_118);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::swap
            (&local_118,&this->input_vertices_);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector(&local_118);
  memset(&local_130,0,0x18);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&local_130);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::swap
            (&local_130,&this->input_edges_);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_130);
  memset(&layer_vertices.
          super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::vector((vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
            *)&layer_vertices.
               super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::swap((vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *)&layer_vertices.
             super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->edge_sites_);
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::~vector((vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
             *)&layer_vertices.
                super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::vector((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
            *)local_160);
  sVar3 = std::
          vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
          ::size(&this->layers_);
  if (9 < sVar3) {
    bVar2 = false;
    __end2 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::begin
                       (&this->layer_options_);
    options = (GraphOptions *)
              std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::end
                        (&this->layer_options_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<S2Builder::GraphOptions_*,_std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>_>
                                       *)&options), bVar1) {
      filter_tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<S2Builder::GraphOptions_*,_std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>_>
                    ::operator*(&__end2);
      bVar1 = GraphOptions::allow_vertex_filtering
                        ((GraphOptions *)
                         filter_tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      bVar2 = (bVar2 & bVar1) != 0;
      __gnu_cxx::
      __normal_iterator<S2Builder::GraphOptions_*,_std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>_>
      ::operator++(&__end2);
    }
    if (bVar2 != false) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_1a0)
      ;
      sVar3 = std::
              vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
              ::size(&this->layers_);
      std::
      vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
      ::resize((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                *)local_160,sVar3);
      for (local_1a4 = 0; uVar4 = (ulong)local_1a4,
          sVar3 = std::
                  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                  ::size(&this->layers_), uVar4 < sVar3; local_1a4 = local_1a4 + 1) {
        pvVar5 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)&layer_input_edge_ids.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1a4
                             );
        Graph::FilterVertices
                  (&local_1c0,&this->sites_,pvVar5,(vector<int,_std::allocator<int>_> *)local_1a0);
        this_00 = std::
                  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                  ::operator[]((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                                *)local_160,(long)local_1a4);
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator=
                  (this_00,&local_1c0);
        std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector(&local_1c0);
      }
      memset(local_1d8,0,0x18);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_1d8);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::swap
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_1d8,
                 &this->sites_);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_1d8);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_1a0);
    }
  }
  for (vertices._4_4_ = 0;
      sVar3 = std::
              vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
              ::size(&this->layers_), (ulong)(long)vertices._4_4_ < sVar3;
      vertices._4_4_ = vertices._4_4_ + 1) {
    bVar2 = std::
            vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
            ::empty((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                     *)local_160);
    if (bVar2) {
      local_2a0 = &this->sites_;
    }
    else {
      local_2a0 = std::
                  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                  ::operator[]((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
                                *)local_160,(long)vertices._4_4_);
    }
    graph.is_full_polygon_predicate_._M_invoker = (_Invoker_type)local_2a0;
    options_00 = std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::
                 operator[](&this->layer_options_,(long)vertices._4_4_);
    vertices_00 = graph.is_full_polygon_predicate_._M_invoker;
    pvVar5 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)&layer_input_edge_ids.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)vertices._4_4_);
    input_edge_id_set_ids =
         std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)&input_edge_id_set_lexicon.tmp_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)vertices._4_4_);
    __x = std::
          vector<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>,_std::allocator<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>_>_>
          ::operator[](&this->layer_is_full_polygon_predicates_,(long)vertices._4_4_);
    std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::function(&local_270,__x);
    Graph::Graph((Graph *)local_250,options_00,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)vertices_00,pvVar5,
                 input_edge_id_set_ids,(IdSetLexicon *)local_f0,&this->label_set_ids_,
                 &this->label_set_lexicon_,&local_270);
    std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::~function(&local_270);
    this_01 = std::
              vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
              ::operator[](&this->layers_,(long)vertices._4_4_);
    pLVar6 = std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::operator->
                       (this_01);
    (*pLVar6->_vptr_Layer[3])(pLVar6,local_250,this->error_);
    Graph::~Graph((Graph *)local_250);
  }
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::~vector((vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
             *)local_160);
  IdSetLexicon::~IdSetLexicon((IdSetLexicon *)local_f0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&input_edge_id_set_lexicon.tmp_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             *)&layer_input_edge_ids.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void S2Builder::BuildLayers() {
  // Each output edge has an "input edge id set id" (an int32) representing
  // the set of input edge ids that were snapped to this edge.  The actual
  // InputEdgeIds can be retrieved using "input_edge_id_set_lexicon".
  vector<vector<Edge>> layer_edges;
  vector<vector<InputEdgeIdSetId>> layer_input_edge_ids;
  IdSetLexicon input_edge_id_set_lexicon;
  BuildLayerEdges(&layer_edges, &layer_input_edge_ids,
                  &input_edge_id_set_lexicon);

  // At this point we have no further need for the input geometry or nearby
  // site data, so we clear those fields to save space.
  vector<S2Point>().swap(input_vertices_);
  vector<InputEdge>().swap(input_edges_);
  vector<compact_array<SiteId>>().swap(edge_sites_);

  // If there are a large number of layers, then we build a minimal subset of
  // vertices for each layer.  This ensures that layer types that iterate over
  // vertices will run in time proportional to the size of that layer rather
  // than the size of all layers combined.
  vector<vector<S2Point>> layer_vertices;
  static const int kMinLayersForVertexFiltering = 10;
  if (layers_.size() >= kMinLayersForVertexFiltering) {
    // Disable vertex filtering if it is disallowed by any layer.  (This could
    // be optimized, but in current applications either all layers allow
    // filtering or none of them do.)
    bool allow_vertex_filtering = false;
    for (const auto& options : layer_options_) {
      allow_vertex_filtering &= options.allow_vertex_filtering();
    }
    if (allow_vertex_filtering) {
      vector<Graph::VertexId> filter_tmp;  // Temporary used by FilterVertices.
      layer_vertices.resize(layers_.size());
      for (int i = 0; i < layers_.size(); ++i) {
        layer_vertices[i] = Graph::FilterVertices(sites_, &layer_edges[i],
                                                  &filter_tmp);
      }
      vector<S2Point>().swap(sites_);  // Release memory
    }
  }
  for (int i = 0; i < layers_.size(); ++i) {
    const vector<S2Point>& vertices = (layer_vertices.empty() ?
                                       sites_ : layer_vertices[i]);
    Graph graph(layer_options_[i], &vertices, &layer_edges[i],
                &layer_input_edge_ids[i], &input_edge_id_set_lexicon,
                &label_set_ids_, &label_set_lexicon_,
                layer_is_full_polygon_predicates_[i]);
    layers_[i]->Build(graph, error_);
    // Don't free the layer data until all layers have been built, in order to
    // support building multiple layers at once (e.g. ClosedSetNormalizer).
  }
}